

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::SuggestFieldNumbers
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  Range RVar1;
  Range RVar2;
  char *pcVar3;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  pointer pRVar4;
  bool bVar5;
  Descriptor *pDVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  pointer pRVar10;
  long lVar11;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
  *this_00;
  long lVar12;
  __normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_> __i;
  long lVar13;
  pointer pRVar14;
  string_view element_name;
  Descriptor *message;
  vector<Range,_std::allocator<Range>_> used_ordinals;
  anon_class_32_4_93375ba9 make_error;
  int current_ordinal;
  int fields_to_suggest;
  iterator hints_it;
  Descriptor *local_c0;
  vector<Range,_std::allocator<Range>_> local_b8;
  undefined8 local_98;
  vector<Range,_std::allocator<Range>_> *local_90;
  undefined4 *local_88;
  int *local_80;
  undefined4 local_78;
  int local_74;
  DescriptorBuilder *local_70;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
  *local_68;
  FileDescriptor *local_60;
  pointer local_58;
  iterator local_50;
  VoidPtr local_40;
  code *pcStack_38;
  
  if (0 < file->message_type_count_) {
    this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
               *)&this->message_hints_;
    lVar12 = 0;
    local_70 = this;
    local_68 = this_00;
    local_60 = file;
    do {
      local_c0 = file->message_types_ + lVar12;
      local_50 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                 ::find<google::protobuf::Descriptor_const*>(this_00,&local_c0);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                  *)this_00);
      local_98 = (Descriptor **)0x0;
      bVar5 = absl::lts_20250127::container_internal::operator==(&local_50,(iterator *)&local_98);
      if (!bVar5) {
        local_58 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                   ::iterator::operator->(&local_50);
        iVar8 = (local_58->second).fields_to_suggest;
        local_74 = 3;
        if (iVar8 < 3) {
          local_74 = iVar8;
        }
        if (0 < iVar8) {
          local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          pDVar6 = local_c0;
          if (0 < local_c0->field_count_) {
            lVar11 = 4;
            lVar13 = 0;
            do {
              iVar8 = *(int *)(&pDVar6->fields_->super_SymbolBase + lVar11);
              if (0xe0000000 < iVar8 + 0xe0000000U) {
                if ((local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                     super__Vector_impl_data._M_start ==
                     local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                     super__Vector_impl_data._M_finish) ||
                   (local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].to != iVar8)) {
                  local_98 = (Descriptor **)CONCAT44(iVar8 + 1,iVar8);
                  std::vector<Range,_std::allocator<Range>_>::push_back
                            (&local_b8,(value_type *)&local_98);
                  pDVar6 = local_c0;
                }
                else {
                  local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].to = iVar8 + 1;
                }
              }
              lVar13 = lVar13 + 1;
              lVar11 = lVar11 + 0x58;
            } while (lVar13 < pDVar6->field_count_);
          }
          if (0 < pDVar6->extension_count_) {
            lVar11 = 4;
            lVar13 = 0;
            do {
              iVar8 = *(int *)(&pDVar6->extensions_->super_SymbolBase + lVar11);
              if (0xe0000000 < iVar8 + 0xe0000000U) {
                if ((local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                     super__Vector_impl_data._M_start ==
                     local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                     super__Vector_impl_data._M_finish) ||
                   (local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].to != iVar8)) {
                  local_98 = (Descriptor **)CONCAT44(iVar8 + 1,iVar8);
                  std::vector<Range,_std::allocator<Range>_>::push_back
                            (&local_b8,(value_type *)&local_98);
                  pDVar6 = local_c0;
                }
                else {
                  local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].to = iVar8 + 1;
                }
              }
              lVar13 = lVar13 + 1;
              lVar11 = lVar11 + 0x58;
            } while (lVar13 < pDVar6->extension_count_);
          }
          if (0 < pDVar6->reserved_range_count_) {
            lVar11 = 0;
            do {
              iVar8 = pDVar6->reserved_ranges_[lVar11].start;
              if (0x1fffffff < iVar8) {
                iVar8 = 0x20000000;
              }
              iVar9 = pDVar6->reserved_ranges_[lVar11].end;
              if (iVar8 < 1) {
                iVar8 = 0;
              }
              if (0x1fffffff < iVar9) {
                iVar9 = 0x20000000;
              }
              if (iVar8 < iVar9) {
                local_98 = (Descriptor **)CONCAT44(iVar9,iVar8);
                std::vector<Range,_std::allocator<Range>_>::push_back
                          (&local_b8,(value_type *)&local_98);
                pDVar6 = local_c0;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < pDVar6->reserved_range_count_);
          }
          if (0 < pDVar6->extension_range_count_) {
            lVar11 = 4;
            lVar13 = 0;
            do {
              iVar8 = *(int *)((long)pDVar6->extension_ranges_ + lVar11 + -4);
              if (0x1fffffff < iVar8) {
                iVar8 = 0x20000000;
              }
              iVar9 = *(int *)((long)&pDVar6->extension_ranges_->start_ + lVar11);
              if (iVar8 < 1) {
                iVar8 = 0;
              }
              if (0x1fffffff < iVar9) {
                iVar9 = 0x20000000;
              }
              if (iVar8 < iVar9) {
                local_98 = (Descriptor **)CONCAT44(iVar9,iVar8);
                std::vector<Range,_std::allocator<Range>_>::push_back
                          (&local_b8,(value_type *)&local_98);
                pDVar6 = local_c0;
              }
              lVar13 = lVar13 + 1;
              lVar11 = lVar11 + 0x28;
            } while (lVar13 < pDVar6->extension_range_count_);
          }
          local_98 = (Descriptor **)0x200000001fffffff;
          std::vector<Range,_std::allocator<Range>_>::push_back(&local_b8,(value_type *)&local_98);
          local_98 = (Descriptor **)0x4e1f00004a38;
          std::vector<Range,_std::allocator<Range>_>::push_back(&local_b8,(value_type *)&local_98);
          pRVar4 = local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pRVar10 = local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar13 = (long)local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                           super__Vector_impl_data._M_start;
            uVar7 = lVar13 >> 3;
            lVar11 = 0x3f;
            if (uVar7 != 0) {
              for (; uVar7 >> lVar11 == 0; lVar11 = lVar11 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range*,std::vector<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range,std::allocator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__3>>
                      (local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                       super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar13 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range*,std::vector<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range,std::allocator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__3>>
                        (pRVar10,pRVar4);
            }
            else {
              pRVar14 = pRVar10 + 0x10;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range*,std::vector<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range,std::allocator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__3>>
                        (pRVar10,pRVar14);
              for (; pRVar14 != pRVar4; pRVar14 = pRVar14 + 1) {
                RVar1 = *pRVar14;
                pRVar10 = pRVar14;
                while( true ) {
                  RVar2 = pRVar10[-1];
                  if ((RVar2.from <= RVar1.from) &&
                     ((RVar2.from < RVar1.from || (RVar2.to <= RVar1.to)))) break;
                  *pRVar10 = RVar2;
                  pRVar10 = pRVar10 + -1;
                }
                *pRVar10 = RVar1;
              }
            }
          }
          file = local_60;
          this_00 = local_68;
          local_78 = 1;
          if ((local_58->second).first_reason != (Message *)0x0) {
            local_90 = &local_b8;
            local_88 = &local_78;
            local_80 = &local_74;
            pcVar3 = (local_c0->all_names_).payload_;
            element_name._M_len = (ulong)*(ushort *)(pcVar3 + 2);
            element_name._M_str = pcVar3 + ~element_name._M_len;
            pcStack_38 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
            ;
            make_error_00.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
            ;
            make_error_00.ptr_.obj = &local_98;
            local_98 = &local_c0;
            local_40.obj = &local_98;
            AddError(local_70,element_name,(local_58->second).first_reason,
                     (local_58->second).first_reason_location,make_error_00);
          }
          if (local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8.super__Vector_base<Range,_std::allocator<Range>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < file->message_type_count_);
  }
  return;
}

Assistant:

void DescriptorBuilder::SuggestFieldNumbers(FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  for (int message_index = 0; message_index < file->message_type_count();
       message_index++) {
    const Descriptor* message = &file->message_types_[message_index];
    auto hints_it = message_hints_.find(message);
    if (hints_it == message_hints_.end()) continue;
    auto* hints = &hints_it->second;
    constexpr int kMaxSuggestions = 3;
    int fields_to_suggest = std::min(kMaxSuggestions, hints->fields_to_suggest);
    if (fields_to_suggest <= 0) continue;
    struct Range {
      int from;
      int to;
    };
    std::vector<Range> used_ordinals;
    auto add_ordinal = [&](int ordinal) {
      if (ordinal <= 0 || ordinal > FieldDescriptor::kMaxNumber) return;
      if (!used_ordinals.empty() && ordinal == used_ordinals.back().to) {
        used_ordinals.back().to = ordinal + 1;
      } else {
        used_ordinals.push_back({ordinal, ordinal + 1});
      }
    };
    auto add_range = [&](int from, int to) {
      from = std::max(0, std::min(FieldDescriptor::kMaxNumber + 1, from));
      to = std::max(0, std::min(FieldDescriptor::kMaxNumber + 1, to));
      if (from >= to) return;
      used_ordinals.push_back({from, to});
    };
    for (int i = 0; i < message->field_count(); i++) {
      add_ordinal(message->field(i)->number());
    }
    for (int i = 0; i < message->extension_count(); i++) {
      add_ordinal(message->extension(i)->number());
    }
    for (int i = 0; i < message->reserved_range_count(); i++) {
      auto range = message->reserved_range(i);
      add_range(range->start, range->end);
    }
    for (int i = 0; i < message->extension_range_count(); i++) {
      auto range = message->extension_range(i);
      add_range(range->start_number(), range->end_number());
    }
    used_ordinals.push_back(
        {FieldDescriptor::kMaxNumber, FieldDescriptor::kMaxNumber + 1});
    used_ordinals.push_back({FieldDescriptor::kFirstReservedNumber,
                             FieldDescriptor::kLastReservedNumber});
    std::sort(used_ordinals.begin(), used_ordinals.end(),
              [](Range lhs, Range rhs) {
                return std::tie(lhs.from, lhs.to) < std::tie(rhs.from, rhs.to);
              });
    int current_ordinal = 1;
    if (hints->first_reason) {
      auto make_error = [&] {
        std::stringstream id_list;
        id_list << "Suggested field numbers for " << message->full_name()
                << ": ";
        const char* separator = "";
        for (auto& current_range : used_ordinals) {
          while (current_ordinal < current_range.from &&
                 fields_to_suggest > 0) {
            id_list << separator << current_ordinal++;
            separator = ", ";
            fields_to_suggest--;
          }
          if (fields_to_suggest == 0) break;
          current_ordinal = std::max(current_ordinal, current_range.to);
        }
        return id_list.str();
      };
      AddError(message->full_name(), *hints->first_reason,
               hints->first_reason_location, make_error);
    }
  }
}